

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkDepends.cxx
# Opt level: O2

cmGeneratorTarget * __thiscall
cmComputeLinkDepends::FindTargetToLink(cmComputeLinkDepends *this,int depender_index,string *name)

{
  cmGeneratorTarget *pcVar1;
  cmGeneratorTarget *pcVar2;
  
  pcVar2 = this->Target;
  if ((-1 < depender_index) &&
     (pcVar1 = (this->EntryList).
               super__Vector_base<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
               ._M_impl.super__Vector_impl_data._M_start[(uint)depender_index].Target,
     pcVar1 != (cmGeneratorTarget *)0x0)) {
    pcVar2 = pcVar1;
  }
  pcVar2 = cmGeneratorTarget::FindTargetToLink(pcVar2,name);
  return pcVar2;
}

Assistant:

cmGeneratorTarget const*
cmComputeLinkDepends::FindTargetToLink(int depender_index,
                                       const std::string& name)
{
  // Look for a target in the scope of the depender.
  cmGeneratorTarget const* from = this->Target;
  if(depender_index >= 0)
    {
    if(cmGeneratorTarget const* depender =
       this->EntryList[depender_index].Target)
      {
      from = depender;
      }
    }
  return from->FindTargetToLink(name);
}